

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFont.cpp
# Opt level: O0

s32 __thiscall irr::gui::CGUIFont::getAreaFromCharacter(CGUIFont *this,wchar_t c)

{
  bool bVar1;
  pointer ppVar2;
  long in_RDI;
  const_iterator n;
  map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
  *in_stack_ffffffffffffffc8;
  _Self local_28;
  _Self local_20 [3];
  s32 local_4;
  
  local_20[0]._M_node =
       (_Base_ptr)
       ::std::map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
       ::find(in_stack_ffffffffffffffc8,(key_type *)0x3b99b5);
  local_28._M_node =
       (_Base_ptr)
       ::std::map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
       ::end(in_stack_ffffffffffffffc8);
  bVar1 = ::std::operator!=(local_20,&local_28);
  if (bVar1) {
    ppVar2 = ::std::_Rb_tree_const_iterator<std::pair<const_wchar_t,_int>_>::operator->
                       ((_Rb_tree_const_iterator<std::pair<const_wchar_t,_int>_> *)0x3b99ec);
    local_4 = ppVar2->second;
  }
  else {
    local_4 = *(s32 *)(in_RDI + 0x70);
  }
  return local_4;
}

Assistant:

s32 CGUIFont::getAreaFromCharacter(const wchar_t c) const
{
	auto n = CharacterMap.find(c);
	if (n != CharacterMap.end())
		return n->second;
	else
		return WrongCharacter;
}